

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int read_mllr_files(char *mllrmatfn,char *cb2mllrfn,float32 *****out_A,float32 ****out_B,
                   int32 **out_cb2mllr,uint32 *out_n_mllr_class,uint32 *out_n_mgau,
                   uint32 *out_n_feat,uint32 **out_veclen,uint32 inverse)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  long ln;
  ulong uVar5;
  ulong uVar6;
  uint32 n_mllr_class_rd;
  int32 **local_40;
  char *local_38;
  int32 **ppiVar4;
  
  local_40 = out_cb2mllr;
  local_38 = cb2mllrfn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
          ,0x48,"Read %s\n",mllrmatfn);
  iVar1 = read_reg_mat(mllrmatfn,out_veclen,out_n_mllr_class,out_n_feat,out_A,out_B);
  if (iVar1 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x51,"n_mllr_class = %d\n",(ulong)*out_n_mllr_class);
    if (inverse != 0) {
      for (uVar6 = 0; uVar6 < *out_n_mllr_class; uVar6 = uVar6 + 1) {
        for (uVar5 = 0; uVar5 < *out_n_feat; uVar5 = uVar5 + 1) {
          invert((*out_A)[uVar6][uVar5],(*out_A)[uVar6][uVar5],(*out_veclen)[uVar5]);
        }
      }
    }
    mllrmatfn = local_38;
    iVar2 = strcmp(local_38,".1cls.");
    if (iVar2 == 0) {
      n_mllr_class_rd = 1;
      *local_40 = (int32 *)0x0;
      *out_n_mgau = 0;
      ppiVar4 = local_40;
    }
    else {
      uVar3 = s3cb2mllr_read(mllrmatfn,local_40,out_n_mgau,&n_mllr_class_rd);
      ppiVar4 = (int32 **)(ulong)uVar3;
      if (uVar3 != 0) {
        ln = 0x65;
        goto LAB_00102d5d;
      }
    }
    if (n_mllr_class_rd == *out_n_mllr_class) {
      return (int)ppiVar4;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x6a,"# MLLR class, %u, inconsistent w/ cb2mllr # MLLR class, %u\n");
  }
  else {
    ln = 0x4f;
LAB_00102d5d:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,ln,"Unable to read %s\n",mllrmatfn);
  }
  exit(1);
}

Assistant:

static int
read_mllr_files(const char *mllrmatfn,
		const char *cb2mllrfn,
		float32 *****out_A,
		float32 ****out_B,
		int32 **out_cb2mllr,
		uint32 *out_n_mllr_class,
		uint32 *out_n_mgau,
		uint32 *out_n_feat,
		uint32 **out_veclen,
		uint32 inverse)
{
    uint32 n_mllr_class_rd, m, j;

    E_INFO("Read %s\n", mllrmatfn);
    if (read_reg_mat(mllrmatfn,
	 	     out_veclen,
		     out_n_mllr_class,
		     out_n_feat,
		     out_A,
		     out_B) != S3_SUCCESS) {
	E_FATAL("Unable to read %s\n",mllrmatfn);
    }
    E_INFO("n_mllr_class = %d\n", *out_n_mllr_class);

    if (inverse) {
	for (m = 0; m < *out_n_mllr_class; ++m) {
	    for (j = 0; j < *out_n_feat; ++j) {
		invert((*out_A)[m][j], (*out_A)[m][j], (*out_veclen)[j]);
	    }
	}
    }

    if (strcmp(cb2mllrfn, ".1cls.") == 0) {
	n_mllr_class_rd = 1;
        *out_cb2mllr = NULL;
	*out_n_mgau = 0;
    }
    else {
	if (s3cb2mllr_read(cb2mllrfn,
			   out_cb2mllr,
			   out_n_mgau,
			   &n_mllr_class_rd) != S3_SUCCESS) {
	    E_FATAL("Unable to read %s\n", cb2mllrfn);
	}
    }
    if (n_mllr_class_rd != *out_n_mllr_class) {
	E_FATAL("# MLLR class, %u, inconsistent w/ cb2mllr # MLLR class, %u\n",
		n_mllr_class_rd, *out_n_mllr_class);
    }
    return S3_SUCCESS;
}